

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestWrongOutputInDepfileCausesRebuild::
RegisterBuildTestWrongOutputInDepfileCausesRebuild
          (RegisterBuildTestWrongOutputInDepfileCausesRebuild *this)

{
  RegisterBuildTestWrongOutputInDepfileCausesRebuild *this_local;
  
  RegisterTest(BuildTestWrongOutputInDepfileCausesRebuild::Create,
               "BuildTest.WrongOutputInDepfileCausesRebuild");
  return;
}

Assistant:

TEST_F(BuildTest, WrongOutputInDepfileCausesRebuild) {
  string err;
  const char* manifest =
"rule cc\n"
"  command = cc $in\n"
"  depfile = $out.d\n"
"build foo.o: cc foo.c\n";

  fs_.Create("foo.c", "");
  fs_.Create("foo.o", "");
  fs_.Create("header.h", "");
  fs_.Create("foo.o.d", "bar.o.d: header.h\n");

  RebuildTarget("foo.o", manifest, "build_log", "ninja_deps");
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}